

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_TapScriptSign_Test::TestBody(TransactionContext_TapScriptSign_Test *this)

{
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::SignParameter> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_10;
  CfdException *except_1;
  TransactionContext invalid_sign_tx;
  AssertionResult gtest_ar_9;
  CfdException *except;
  AssertionResult gtest_ar_8;
  SignParameter sign_param;
  AssertionResult gtest_ar_7;
  SchnorrSignature sig;
  AssertionResult gtest_ar_6;
  ByteData256 sighash;
  AssertionResult gtest_ar_5;
  ByteData256 tap_leaf_hash;
  AssertionResult gtest_ar_4;
  Address addr2;
  TransactionContext tx2;
  OutPoint outpoint2;
  UtxoData utxo;
  AssertionResult gtest_ar_3;
  SigHashType sighash_all;
  AssertionResult gtest_ar_2;
  Amount amt1;
  Privkey key1;
  OutPoint outpoint1;
  TransactionContext tx1;
  Address txout1_addr;
  AddressFactory addr_factory;
  AssertionResult gtest_ar_1;
  ByteData256 *node;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range1;
  TaprootScriptTree tree;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  Script redeem_script;
  ScriptBuilder builder;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  bool is_parity;
  Pubkey pubkey;
  Privkey key;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *in_stack_ffffffffffffe558
  ;
  undefined4 uVar5;
  undefined8 uVar4;
  string *tx_hex;
  undefined4 in_stack_ffffffffffffe560;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffe564;
  UtxoData *in_stack_ffffffffffffe568;
  TransactionContext *in_stack_ffffffffffffe570;
  ByteData *in_stack_ffffffffffffe578;
  SignParameter *in_stack_ffffffffffffe580;
  allocator_type *in_stack_ffffffffffffe588;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffe590;
  iterator in_stack_ffffffffffffe598;
  TransactionContext *in_stack_ffffffffffffe5a0;
  AddressFactory *in_stack_ffffffffffffe5a8;
  undefined1 **local_1a48;
  UtxoData *in_stack_ffffffffffffe5c0;
  TransactionContext *pTVar7;
  UtxoData *object;
  UtxoData *in_stack_ffffffffffffe5d0;
  Address *in_stack_ffffffffffffe5d8;
  TransactionContext *in_stack_ffffffffffffe5e0;
  SchnorrPubkey *in_stack_ffffffffffffe5e8;
  TaprootScriptTree *in_stack_ffffffffffffe5f0;
  OutPoint *in_stack_ffffffffffffe5f8;
  TransactionContext *in_stack_ffffffffffffe600;
  SignParameter *in_stack_ffffffffffffe618;
  SignParameter *in_stack_ffffffffffffe620;
  undefined8 ****ppppuVar8;
  undefined8 ****local_19d8;
  undefined4 in_stack_ffffffffffffe684;
  undefined1 has_grind_r;
  Amount *in_stack_ffffffffffffe688;
  string *this_00;
  SigHashType *in_stack_ffffffffffffe690;
  undefined7 in_stack_ffffffffffffe698;
  undefined1 in_stack_ffffffffffffe69f;
  Pubkey *in_stack_ffffffffffffe6a0;
  undefined7 in_stack_ffffffffffffe6a8;
  AddressType address_type;
  undefined8 in_stack_ffffffffffffe6c0;
  ByteData256 *local_18f8;
  TransactionContext local_1881 [6];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffec08;
  TransactionContext *in_stack_ffffffffffffec10;
  uint32_t *in_stack_ffffffffffffec18;
  ByteData256 *in_stack_ffffffffffffec20;
  SigHashType *in_stack_ffffffffffffec28;
  OutPoint *in_stack_ffffffffffffec30;
  TransactionContext *in_stack_ffffffffffffec38;
  ByteData *in_stack_ffffffffffffec50;
  undefined1 *local_1388;
  undefined8 local_1380;
  undefined1 local_1359 [257];
  AssertHelper local_1258;
  Message local_1250;
  string local_1248;
  AssertionResult local_1228;
  undefined1 ****local_1210;
  undefined8 ***local_1208 [15];
  undefined1 ****local_1190;
  undefined8 local_1188;
  ByteData local_1168 [6];
  AssertHelper local_10d8;
  Message local_10d0;
  string local_10c8;
  AssertionResult local_10a8;
  SchnorrSignature local_1098;
  AssertHelper local_1070;
  Message local_1068;
  string local_1060;
  AssertionResult local_1040;
  ByteData256 local_1030;
  AssertHelper local_1018;
  Message local_1010;
  string local_1008;
  AssertionResult local_fe8;
  ByteData256 local_fd8;
  AssertHelper local_fc0;
  Message local_fb8;
  string local_fb0;
  AssertionResult local_f90;
  Amount local_f80;
  allocator local_f69;
  string local_f68;
  Address local_f48;
  AbstractTransaction local_dd0 [11];
  Txid local_d18;
  OutPoint local_cf8;
  string local_cd0;
  string local_cb0 [32];
  string local_c90 [32];
  Script local_c70;
  Txid local_c38;
  undefined8 local_c18;
  Txid local_bf0;
  undefined4 local_bd0;
  Script local_bc8 [2];
  Address local_b58;
  string local_9e0 [32];
  int64_t local_9c0;
  undefined1 local_9b8;
  AddressType local_9b0;
  undefined8 local_9a8;
  AssertHelper local_728;
  Message local_720;
  string local_718;
  AssertionResult local_6f8;
  Amount local_6e8;
  SigHashType local_6d4;
  Pubkey local_6c8;
  SigHashType local_6ac;
  AssertHelper local_6a0;
  Message local_698;
  string local_690;
  AssertionResult local_670;
  Amount local_660;
  undefined1 local_649 [105];
  Txid local_5e0;
  OutPoint local_5c0;
  AbstractTransaction local_598 [11];
  Address local_4e0;
  AssertHelper local_340;
  Message local_338;
  ByteData256 local_330;
  string local_318;
  AssertionResult local_2f8;
  reference local_2e8;
  ByteData256 *local_2e0;
  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
  local_2d8;
  pointer *local_2d0;
  TaprootScriptTree local_2c8;
  undefined1 local_232;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  ByteData256 *local_1e8;
  ByteData256 local_1e0;
  ByteData256 local_1c8;
  ByteData256 local_1b0;
  Script local_188;
  ByteData local_150;
  ScriptBuilder local_138;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  string local_c8;
  AssertionResult local_a8;
  SchnorrPubkey local_98;
  bool local_79;
  Pubkey local_78;
  allocator local_49;
  string local_48;
  Privkey local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_49);
  cfd::core::Privkey::Privkey(&local_28,&local_48,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Privkey::GeneratePubkey(&local_78,&local_28,true);
  local_79 = false;
  cfd::core::SchnorrPubkey::FromPubkey(&local_98,&local_78,&local_79);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_c8,&local_98);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [65])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560));
  std::__cxx11::string::~string((string *)&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x253a47);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x355,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x253aaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x253aff);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
             (bool *)in_stack_ffffffffffffe558,(type *)0x253b18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&local_e8,(AssertionResult *)"is_parity","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x356,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message((Message *)0x253c16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x253c91);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x253c9e);
  cfd::core::SchnorrPubkey::GetData(&local_150,&local_98);
  cfd::core::ScriptBuilder::AppendData(&local_138,&local_150);
  cfd::core::ByteData::~ByteData((ByteData *)0x253cdb);
  cfd::core::ScriptBuilder::AppendOperator
            (&local_138,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&local_188,&local_138);
  local_232 = 1;
  local_1e8 = &local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_209);
  cfd::core::ByteData256::ByteData256(&local_1e0,&local_208);
  local_1e8 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_230,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
             ,&local_231);
  cfd::core::ByteData256::ByteData256(&local_1c8,&local_230);
  local_232 = 0;
  local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_1e0;
  local_1b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  std::allocator<cfd::core::ByteData256>::allocator((allocator<cfd::core::ByteData256> *)0x253e05);
  __l._M_len = (size_type)in_stack_ffffffffffffe5a0;
  __l._M_array = (iterator)in_stack_ffffffffffffe598;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             in_stack_ffffffffffffe590,__l,(allocator_type *)in_stack_ffffffffffffe588);
  std::allocator<cfd::core::ByteData256>::~allocator((allocator<cfd::core::ByteData256> *)0x253e39);
  local_18f8 = &local_1b0;
  do {
    local_18f8 = local_18f8 + -1;
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x253e6e);
  } while (local_18f8 != &local_1e0);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_2c8,&local_188);
  local_2d0 = (pointer *)
              ((long)&local_1b0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 0x10);
  local_2d8._M_current =
       (ByteData256 *)
       std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                 (in_stack_ffffffffffffe558);
  local_2e0 = (ByteData256 *)
              std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                        (in_stack_ffffffffffffe558);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
                       (__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                        *)in_stack_ffffffffffffe558);
    address_type = (AddressType)in_stack_ffffffffffffe6c0;
    has_grind_r = (undefined1)((uint)in_stack_ffffffffffffe684 >> 0x18);
    if (!bVar1) break;
    local_2e8 = __gnu_cxx::
                __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                ::operator*(&local_2d8);
    cfd::core::TaprootScriptTree::AddBranch(&local_2c8,local_2e8);
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
    ::operator++(&local_2d8);
  }
  cfd::core::TaprootScriptTree::GetTapLeafHash(&local_330,&local_2c8);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_318,&local_330);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [65])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560));
  std::__cxx11::string::~string((string *)&local_318);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x2541d2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x254278);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x362,pcVar3);
    address_type = (AddressType)pcVar3;
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    testing::Message::~Message((Message *)0x2542db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x254333);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
             (NetType)((ulong)in_stack_ffffffffffffe558 >> 0x20));
  cfd::AddressFactory::CreateTaprootAddress
            (in_stack_ffffffffffffe5a8,(TaprootScriptTree *)in_stack_ffffffffffffe5a0,
             (SchnorrPubkey *)in_stack_ffffffffffffe598);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
             (uint32_t)((ulong)in_stack_ffffffffffffe558 >> 0x20),
             (uint32_t)in_stack_ffffffffffffe558);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffe558 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_649 + 0x49),
             "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd",
             (allocator *)((long)local_649 + 0x48));
  cfd::core::Txid::Txid(&local_5e0,(string *)(local_649 + 0x49));
  cfd::core::OutPoint::OutPoint(&local_5c0,&local_5e0,0);
  cfd::core::Txid::~Txid((Txid *)0x2543f4);
  std::__cxx11::string::~string((string *)(local_649 + 0x49));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_649 + 0x48));
  pTVar7 = (TransactionContext *)local_649;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_649 + 1),"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)pTVar7);
  cfd::core::Privkey::FromWif
            ((Privkey *)((long)local_649 + 0x21),(string *)((long)local_649 + 1),kCustomChain,true);
  std::__cxx11::string::~string((string *)((long)local_649 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_649);
  cfd::TransactionContext::AddTxIn(in_stack_ffffffffffffe5a0,(OutPoint *)in_stack_ffffffffffffe598);
  cfd::core::Amount::Amount(&local_660,0x9502f518);
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,(Amount *)in_stack_ffffffffffffe5d0
            );
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_690,local_598);
  testing::internal::EqHelper<false>::Compare<char[189],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [189])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560));
  std::__cxx11::string::~string((string *)&local_690);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_670);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_698);
    in_stack_ffffffffffffe6a0 =
         (Pubkey *)testing::AssertionResult::failure_message((AssertionResult *)0x2546ae);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x36f,(char *)in_stack_ffffffffffffe6a0);
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    testing::Message::~Message((Message *)0x254711);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x254769);
  cfd::core::SigHashType::SigHashType(&local_6ac);
  cfd::core::Privkey::GetPubkey(&local_6c8,(Privkey *)((long)local_649 + 0x21));
  cfd::core::SigHashType::SigHashType(&local_6d4,&local_6ac);
  cfd::core::Amount::Amount(&local_6e8,2500000000);
  uVar6 = 1;
  uVar4 = CONCAT44(uVar5,4);
  cfd::TransactionContext::SignWithPrivkeySimple
            (pTVar7,(OutPoint *)CONCAT17(uVar2,in_stack_ffffffffffffe6a8),in_stack_ffffffffffffe6a0,
             (Privkey *)CONCAT17(in_stack_ffffffffffffe69f,in_stack_ffffffffffffe698),
             in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,address_type,(bool)has_grind_r);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x25480e);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_718,local_598);
  testing::internal::EqHelper<false>::Compare<char[407],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [407])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x254919);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x373,pcVar3);
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    testing::Message::~Message((Message *)0x25497c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2549d4);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe5c0);
  local_c18 = 0;
  cfd::core::AbstractTransaction::GetTxid(&local_c38,local_598);
  cfd::core::Txid::operator=(&local_bf0,&local_c38);
  cfd::core::Txid::~Txid((Txid *)0x254a2a);
  local_bd0 = 0;
  cfd::core::Address::GetLockingScript(&local_c70,&local_4e0);
  cfd::core::Script::operator=(local_bc8,&local_c70);
  cfd::core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::Script::GetHex_abi_cxx11_(&local_cd0,local_bc8);
  std::operator+((char *)in_stack_ffffffffffffe5a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe568,(char *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  this_00 = local_c90;
  std::__cxx11::string::operator=(local_9e0,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_cb0);
  std::__cxx11::string::~string((string *)&local_cd0);
  cfd::core::Address::operator=(&local_b58,&local_4e0);
  local_9b8 = local_660.ignore_check_;
  local_9c0 = local_660.amount_;
  local_9b0 = cfd::core::Address::GetAddressType(&local_4e0);
  local_9a8 = 0;
  cfd::core::AbstractTransaction::GetTxid(&local_d18,local_598);
  cfd::core::OutPoint::OutPoint(&local_cf8,&local_d18,0);
  cfd::core::Txid::~Txid((Txid *)0x254ba9);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,uVar6),
             (uint32_t)((ulong)uVar4 >> 0x20),(uint32_t)uVar4);
  cfd::TransactionContext::AddInput(in_stack_ffffffffffffe570,in_stack_ffffffffffffe568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f68,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",&local_f69);
  cfd::core::Address::Address(&local_f48,&local_f68);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  cfd::core::Amount::Amount(&local_f80,0x9502f130);
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,(Amount *)in_stack_ffffffffffffe5d0
            );
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_fb0,local_dd0);
  testing::internal::EqHelper<false>::Compare<char[165],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [165])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_fb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f90);
  if (!bVar1) {
    testing::Message::Message(&local_fb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x254ebd);
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x385,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fc0,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    testing::Message::~Message((Message *)0x254f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x254f78);
  cfd::core::TaprootScriptTree::GetTapLeafHash(&local_fd8,&local_2c8);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1008,&local_fd8);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [65])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_1008);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_fe8);
  if (!bVar1) {
    testing::Message::Message(&local_1010);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x25508d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x388,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    testing::Message::~Message((Message *)0x2550f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255148);
  tx_hex = (string *)0x0;
  cfd::TransactionContext::CreateSignatureHashByTaproot
            (in_stack_ffffffffffffec38,in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
             in_stack_ffffffffffffec20,in_stack_ffffffffffffec18,in_stack_ffffffffffffec50);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1060,&local_1030);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [65])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_1060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1040);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x255284);
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x38a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,&local_1068);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    testing::Message::~Message((Message *)0x2552e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25533f);
  cfd::core::SchnorrUtil::Sign(&local_1098,&local_1030,&local_28);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_(&local_10c8,&local_1098,false);
  testing::internal::EqHelper<false>::Compare<char[129],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [129])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_10c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10a8);
  if (!bVar1) {
    testing::Message::Message(&local_10d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x25545e);
    testing::internal::AssertHelper::AssertHelper
              (&local_10d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x38d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10d8,&local_10d0);
    testing::internal::AssertHelper::~AssertHelper(&local_10d8);
    testing::Message::~Message((Message *)0x2554c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255519);
  cfd::core::SchnorrSignature::SetSigHashType(&local_1098,&local_6ac);
  cfd::core::SchnorrSignature::GetData(local_1168,&local_1098,true);
  cfd::SignParameter::SignParameter(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
  cfd::core::ByteData::~ByteData((ByteData *)0x255570);
  local_1210 = (undefined1 ****)local_1208;
  cfd::SignParameter::SignParameter(in_stack_ffffffffffffe620,in_stack_ffffffffffffe618);
  local_1190 = (undefined1 ****)local_1208;
  local_1188 = 1;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x2555c0);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe5a0;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe598;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (in_stack_ffffffffffffe590,__l_00,(allocator_type *)in_stack_ffffffffffffe588);
  cfd::TransactionContext::AddTapScriptSign
            (in_stack_ffffffffffffe600,in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
             in_stack_ffffffffffffe5e8,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffe5e0,(ByteData *)in_stack_ffffffffffffe5d8);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffe570);
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x255635);
  ppppuVar8 = local_1208;
  local_19d8 = &local_1190;
  do {
    local_19d8 = local_19d8 + -0xf;
    cfd::SignParameter::~SignParameter((SignParameter *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  } while (local_19d8 != ppppuVar8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1248,local_dd0);
  testing::internal::EqHelper<false>::Compare<char[569],std::__cxx11::string>
            ((char *)in_stack_ffffffffffffe578,(char *)in_stack_ffffffffffffe570,
             (char (*) [569])in_stack_ffffffffffffe568,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::__cxx11::string::~string((string *)&local_1248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1228);
  if (!bVar1) {
    testing::Message::Message(&local_1250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2558b5);
    testing::internal::AssertHelper::AssertHelper
              (&local_1258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x392,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1258,&local_1250);
    testing::internal::AssertHelper::~AssertHelper(&local_1258);
    testing::Message::~Message((Message *)0x255918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25596d);
  cfd::TransactionContext::Verify((TransactionContext *)in_stack_ffffffffffffe5c0);
  object = (UtxoData *)local_1359;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1359 + 1),
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d3d5400000000"
             ,(allocator *)object);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,uVar6),tx_hex);
  std::__cxx11::string::~string((string *)(local_1359 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1359);
  local_1881[0].super_Transaction.super_AbstractTransaction._1_8_ =
       (long)&local_1881[0].super_Transaction.super_AbstractTransaction.wally_tx_pointer_ + 1;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe5d0,object);
  local_1388 = (undefined1 *)
               ((long)&local_1881[0].super_Transaction.super_AbstractTransaction.wally_tx_pointer_ +
               1);
  local_1380 = 1;
  pTVar7 = local_1881;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x255be7);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe5a0;
  __l_01._M_array = in_stack_ffffffffffffe598;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffe590,
             __l_01,in_stack_ffffffffffffe588);
  cfd::TransactionContext::CollectInputUtxo(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffe570);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x255c3c);
  local_1a48 = &local_1388;
  do {
    local_1a48 = local_1a48 + -0x9e;
    cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  } while (local_1a48 !=
           (undefined1 **)
           ((long)&local_1881[0].super_Transaction.super_AbstractTransaction.wally_tx_pointer_ + 1))
  ;
  cfd::TransactionContext::Verify(pTVar7);
  cfd::TransactionContext::~TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::SignParameter::~SignParameter((SignParameter *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x255fa9);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x255fb6);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x255fc3);
  cfd::core::Address::~Address((Address *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::TransactionContext::~TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x255fea);
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::Privkey::~Privkey((Privkey *)0x256004);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x256011);
  cfd::TransactionContext::~TransactionContext
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::Address::~Address((Address *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x256038);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             in_stack_ffffffffffffe570);
  cfd::core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffe564,uVar6));
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x25606c);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x256079);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x256086);
  cfd::core::Privkey::~Privkey((Privkey *)0x256093);
  return;
}

Assistant:

TEST(TransactionContext, TapScriptSign)
{
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  ScriptBuilder builder;
  builder.AppendData(schnorr_pubkey.GetData());
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  Script redeem_script = builder.Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(redeem_script);
  for (const auto& node : nodes) tree.AddBranch(node);
  EXPECT_EQ("dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513", tree.GetTapLeafHash().GetHex());

  AddressFactory addr_factory(NetType::kRegtest);
  auto txout1_addr = addr_factory.CreateTaprootAddress(tree, schnorr_pubkey);

  TransactionContext tx1(2, 0);
  OutPoint outpoint1(
    Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"), 0);
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");

  tx1.AddTxIn(outpoint1);
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(txout1_addr, amt1);
  EXPECT_EQ("0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000", tx1.GetHex());
  SigHashType sighash_all;
  tx1.SignWithPrivkeySimple(outpoint1, key1.GetPubkey(), key1, sighash_all,
      Amount(int64_t{2500000000}), AddressType::kP2wpkhAddress);
  EXPECT_EQ("02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  UtxoData utxo;
  utxo.block_height = 0;
  utxo.txid = tx1.GetTxid();
  utxo.vout = 0;
  utxo.locking_script = txout1_addr.GetLockingScript();
  utxo.descriptor = "raw(" + utxo.locking_script.GetHex() + ")";
  utxo.address = txout1_addr;
  utxo.amount = amt1;
  utxo.address_type = txout1_addr.GetAddressType();
  utxo.binary_data = nullptr;

  OutPoint outpoint2(tx1.GetTxid(), 0);
  TransactionContext tx2(2, 0);
  tx2.AddInput(utxo);
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(addr2, Amount(int64_t{2499998000}));
  EXPECT_EQ("02000000015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d500000000", tx2.GetHex());
 
  ByteData256 tap_leaf_hash = tree.GetTapLeafHash();
  EXPECT_EQ("dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513", tap_leaf_hash.GetHex());
  auto sighash = tx2.CreateSignatureHashByTaproot(outpoint2, sighash_all, &tap_leaf_hash);
  EXPECT_EQ("80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36", sighash.GetHex());

  auto sig = SchnorrUtil::Sign(sighash, key);
  EXPECT_EQ("f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9", sig.GetHex());
  sig.SetSigHashType(sighash_all);
  SignParameter sign_param(sig.GetData(true));
  tx2.AddTapScriptSign(outpoint2, tree, schnorr_pubkey, {sign_param});

  EXPECT_EQ("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000", tx2.GetHex());

  try {
    tx2.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("The script analysis of tapscript is not supported.", except.what());
  }

  TransactionContext invalid_sign_tx("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d3d5400000000");
  invalid_sign_tx.CollectInputUtxo({utxo});
  try {
    invalid_sign_tx.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("Unmatch locking script.", except.what());
  }
}